

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetDirectoryPropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmGetDirectoryPropertyCommand::InitialPass
          (cmGetDirectoryPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  PolicyStatus PVar3;
  cmGlobalGenerator *this_00;
  cmMakefile *pcVar4;
  char *pcVar5;
  PolicyID id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_91;
  string sd;
  string local_70;
  string variable;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    std::__cxx11::string::string
              ((string *)&variable,"called with incorrect number of arguments",(allocator *)&sd);
    cmCommand::SetError(&this->super_cmCommand,&variable);
    std::__cxx11::string::~string((string *)&variable);
    return false;
  }
  std::__cxx11::string::string((string *)&variable,(string *)pbVar1);
  __lhs = pbVar1 + 1;
  pcVar4 = (this->super_cmCommand).Makefile;
  bVar2 = std::operator==(__lhs,"DIRECTORY");
  if (bVar2) {
    __lhs = pbVar1 + 2;
    if (__lhs == (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string
                ((string *)&sd,"DIRECTORY argument provided without subsequent arguments",
                 (allocator *)&local_70);
      cmCommand::SetError(&this->super_cmCommand,&sd);
      goto LAB_002cec50;
    }
    std::__cxx11::string::string((string *)&sd,(string *)__lhs);
    bVar2 = cmsys::SystemTools::FileIsFullPath(sd._M_dataplus._M_p);
    if (!bVar2) {
      cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::assign((char *)&sd);
      std::__cxx11::string::append((char *)&sd);
      std::__cxx11::string::append((string *)&sd);
    }
    cmsys::SystemTools::CollapseFullPath(&local_70,&sd);
    std::__cxx11::string::operator=((string *)&sd,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    pcVar4 = cmGlobalGenerator::FindMakefile(this_00,&sd);
    if (pcVar4 == (cmMakefile *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_70,
                 "DIRECTORY argument provided but requested directory not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,&local_91);
      cmCommand::SetError(&this->super_cmCommand,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      __lhs = pbVar1 + 3;
    }
    std::__cxx11::string::~string((string *)&sd);
    if (pcVar4 != (cmMakefile *)0x0) goto LAB_002ceb4d;
  }
  else {
LAB_002ceb4d:
    bVar2 = std::operator==(__lhs,"DEFINITION");
    if (!bVar2) {
      if (__lhs->_M_string_length == 0) {
        pcVar5 = (char *)0x0;
      }
      else {
        bVar2 = std::operator==(__lhs,"DEFINITIONS");
        if (bVar2) {
          PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0059);
          if (PVar3 != OLD) {
            if (PVar3 != WARN) goto LAB_002cec1d;
            pcVar4 = (this->super_cmCommand).Makefile;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&sd,(cmPolicies *)0x3b,id);
            cmMakefile::IssueMessage(pcVar4,AUTHOR_WARNING,&sd,false);
            std::__cxx11::string::~string((string *)&sd);
          }
          pcVar5 = cmMakefile::GetDefineFlagsCMP0059((this->super_cmCommand).Makefile);
        }
        else {
LAB_002cec1d:
          pcVar5 = cmMakefile::GetProperty(pcVar4,__lhs);
        }
      }
      bVar2 = true;
      StoreResult(this,&variable,pcVar5);
      goto LAB_002cec70;
    }
    if (__lhs + 1 !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar5 = cmMakefile::GetSafeDefinition(pcVar4,__lhs + 1);
      std::__cxx11::string::string((string *)&sd,pcVar5,(allocator *)&local_70);
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&variable,sd._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&sd);
      bVar2 = true;
      goto LAB_002cec70;
    }
    std::__cxx11::string::string
              ((string *)&sd,
               "A request for a variable definition was made without providing the name of the variable to get."
               ,(allocator *)&local_70);
    cmCommand::SetError(&this->super_cmCommand,&sd);
LAB_002cec50:
    std::__cxx11::string::~string((string *)&sd);
  }
  bVar2 = false;
LAB_002cec70:
  std::__cxx11::string::~string((string *)&variable);
  return bVar2;
}

Assistant:

bool cmGetDirectoryPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::vector<std::string>::const_iterator i = args.begin();
  std::string variable = *i;
  ++i;

  // get the directory argument if there is one
  cmMakefile *dir = this->Makefile;
  if (*i == "DIRECTORY")
    {
    ++i;
    if (i == args.end())
      {
      this->SetError
        ("DIRECTORY argument provided without subsequent arguments");
      return false;
      }
    std::string sd = *i;
    // make sure the start dir is a full path
    if (!cmSystemTools::FileIsFullPath(sd.c_str()))
      {
      sd = this->Makefile->GetCurrentSourceDirectory();
      sd += "/";
      sd += *i;
      }

    // The local generators are associated with collapsed paths.
    sd = cmSystemTools::CollapseFullPath(sd);

    // lookup the makefile from the directory name
    dir = this->Makefile->GetGlobalGenerator()->FindMakefile(sd);
    if (!dir)
      {
      this->SetError
        ("DIRECTORY argument provided but requested directory not found. "
         "This could be because the directory argument was invalid or, "
         "it is valid but has not been processed yet.");
      return false;
      }
    ++i;
    }

  // OK, now we have the directory to process, we just get the requested
  // information out of it

  if ( *i == "DEFINITION" )
    {
    ++i;
    if (i == args.end())
      {
      this->SetError("A request for a variable definition was made without "
                     "providing the name of the variable to get.");
      return false;
      }
    std::string output = dir->GetSafeDefinition(*i);
    this->Makefile->AddDefinition(variable, output.c_str());
    return true;
    }

  const char *prop = 0;
  if (!i->empty())
    {
    if (*i == "DEFINITIONS")
      {
      switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0059))
        {
        case cmPolicies::WARN:
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
        case cmPolicies::OLD:
          this->StoreResult(variable,
                                   this->Makefile->GetDefineFlagsCMP0059());
        return true;
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
        }
      }
    prop = dir->GetProperty(*i);
    }
  this->StoreResult(variable, prop);
  return true;
}